

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O3

void __thiscall sf::WindowBase::create(WindowBase *this,VideoMode mode,String *title,Uint32 style)

{
  pointer pVVar1;
  WindowBase *pWVar2;
  bool bVar3;
  ostream *poVar4;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *pvVar5;
  WindowImpl *pWVar6;
  uint uVar7;
  ContextSettings *in_R9;
  VideoMode mode_00;
  WindowImpl *local_68;
  uint local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 local_40;
  
  uVar7 = mode.bitsPerPixel;
  pWVar6 = mode._0_8_;
  local_68 = pWVar6;
  local_60 = uVar7;
  (*this->_vptr_WindowBase[4])();
  pWVar2 = (anonymous_namespace)::WindowsBaseImpl::fullscreenWindow;
  if ((style & 8) != 0) {
    if ((anonymous_namespace)::WindowsBaseImpl::fullscreenWindow == (WindowBase *)0x0) {
      bVar3 = VideoMode::isValid((VideoMode *)&local_68);
      pWVar6 = local_68;
      uVar7 = local_60;
      pWVar2 = this;
      if (!bVar3) {
        poVar4 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"The requested video mode is not available, switching to a valid mode",
                   0x44);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pvVar5 = VideoMode::getFullscreenModes();
        pVVar1 = (pvVar5->super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pWVar6 = *(WindowImpl **)pVVar1;
        uVar7 = pVVar1->bitsPerPixel;
        pWVar2 = this;
        local_68 = pWVar6;
        local_60 = uVar7;
      }
    }
    else {
      poVar4 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Creating two fullscreen windows is not allowed, switching to windowed mode"
                 ,0x4a);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      style = style & 0xfffffff7;
      pWVar2 = (anonymous_namespace)::WindowsBaseImpl::fullscreenWindow;
    }
  }
  (anonymous_namespace)::WindowsBaseImpl::fullscreenWindow = pWVar2;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0xffffffff00000000;
  local_40 = 0;
  mode_00.height = 0;
  mode_00.width = uVar7;
  mode_00.bitsPerPixel = (uint)title;
  pWVar6 = priv::WindowImpl::create
                     (pWVar6,mode_00,(String *)(ulong)((style & 6) != 0 | style),(Uint32)&local_58,
                      in_R9);
  this->m_impl = pWVar6;
  initialize(this);
  return;
}

Assistant:

void WindowBase::create(VideoMode mode, const String& title, Uint32 style)
{
    // Destroy the previous window implementation
    close();

    // Fullscreen style requires some tests
    if (style & Style::Fullscreen)
    {
        // Make sure there's not already a fullscreen window (only one is allowed)
        if (getFullscreenWindow())
        {
            err() << "Creating two fullscreen windows is not allowed, switching to windowed mode" << std::endl;
            style &= ~static_cast<Uint32>(Style::Fullscreen);
        }
        else
        {
            // Make sure that the chosen video mode is compatible
            if (!mode.isValid())
            {
                err() << "The requested video mode is not available, switching to a valid mode" << std::endl;
                mode = VideoMode::getFullscreenModes()[0];
            }

            // Update the fullscreen window
            setFullscreenWindow(this);
        }
    }

    // Check validity of style according to the underlying platform
    #if defined(SFML_SYSTEM_IOS) || defined(SFML_SYSTEM_ANDROID)
        if (style & Style::Fullscreen)
            style &= ~static_cast<Uint32>(Style::Titlebar);
        else
            style |= Style::Titlebar;
    #else
        if ((style & Style::Close) || (style & Style::Resize))
            style |= Style::Titlebar;
    #endif

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(mode, title, style, ContextSettings(0, 0, 0, 0, 0, 0xFFFFFFFF, false));

    // Perform common initializations
    initialize();
}